

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath_error.hpp
# Opt level: O0

string * __thiscall
jsoncons::jmespath::jmespath_error_category_impl::message_abi_cxx11_
          (jmespath_error_category_impl *this,int ev)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator<char> *in_stack_fffffffffffffee0;
  allocator<char> *paVar1;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  undefined1 local_39 [2];
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15 [21];
  
  switch(in_EDX) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_33);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_34);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_37);
    break;
  case 0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator((allocator<char> *)(local_39 + 1));
    break;
  case 0x16:
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator((allocator<char> *)local_39);
    break;
  case 0x17:
    paVar1 = &local_3a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,(char *)paVar1,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case 0x18:
    paVar1 = &local_3b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,paVar1);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case 0x1c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case 0x1d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_40);
    break;
  case 0x1e:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_41);
  }
  return in_RDI;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<jmespath_errc>(ev))
        {
            case jmespath_errc::expected_identifier:
                return "Expected identifier";
            case jmespath_errc::expected_index:
                return "Expected index";
            case jmespath_errc::expected_A_Za_Z_:
                return "Expected A-Z, a-z, or _";
            case jmespath_errc::expected_rbracket:
                return "Expected ]";
            case jmespath_errc::expected_rparen:
                return "Expected )";
            case jmespath_errc::expected_rbrace:
                return "Expected }";
            case jmespath_errc::expected_colon:
                return "Expected :";
            case jmespath_errc::expected_dot:
                return "Expected \".\"";
            case jmespath_errc::expected_or:
                return "Expected \"||\"";
            case jmespath_errc::expected_and:
                return "Expected \"&&\"";
            case jmespath_errc::expected_multi_select_list:
                return "Expected multi-select-list";
            case jmespath_errc::invalid_number:
                return "Invalid number";
            case jmespath_errc::invalid_literal:
                return "Invalid literal";
            case jmespath_errc::expected_comparator:
                return "Expected <, <=, ==, >=, > or !=";
            case jmespath_errc::expected_key:
                return "Expected key";
            case jmespath_errc::invalid_argument:
                return "Invalid argument type";
            case jmespath_errc::unknown_function:
                return "Unknown function";
            case jmespath_errc::invalid_type:
                return "Invalid type";
            case jmespath_errc::unexpected_end_of_input:
                return "Unexpected end of jmespath input";
            case jmespath_errc::step_cannot_be_zero:
                return "Slice step cannot be zero";
            case jmespath_errc::syntax_error:
                return "Syntax error";
            case jmespath_errc::invalid_codepoint:
                return "Invalid codepoint";
            case jmespath_errc::illegal_escaped_character:
                return "Illegal escaped character";
            case jmespath_errc::unbalanced_parentheses:
                return "Unbalanced parentheses";
            case jmespath_errc::unbalanced_braces:
                return "Unbalanced braces";
            case jmespath_errc::invalid_arity:
                return "Function called with wrong number of arguments";
            case jmespath_errc::identifier_not_found:
                return "Identifier not found";
            case jmespath_errc::expected_index_expression:
                return "Expected index expression";
            case jmespath_errc::undefined_variable:
                return "Undefined variable";
            case jmespath_errc::unknown_error:
            default:
                return "Unknown jmespath parser error";
        }
    }